

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O2

PriceField __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeAsLong
          (PriceUpdateDecoder *this,ByteBuffer *buffer,FieldDef *field_def)

{
  FieldEncodingEnum FVar1;
  int16_t iVar2;
  uint uVar3;
  int iVar4;
  uint64_t uVar5;
  ulong value;
  uint64_t uVar6;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_00;
  anon_union_8_4_08ebdfac_for_PriceField_2 aVar7;
  PriceField PVar8;
  
  FVar1 = field_def->encoding_;
  switch(FVar1) {
  case FIXED1:
    uVar3 = (**(buffer->super_InputStream)._vptr_InputStream)(buffer);
    value = (ulong)(uVar3 & 0xff);
    break;
  case FIXED2:
    iVar2 = tools::ByteBuffer::ReadShort(buffer);
    value = (ulong)iVar2;
    break;
  case FIXED3:
    iVar4 = tools::ByteBuffer::ReadMedium(buffer);
    goto LAB_001ce73b;
  case FIXED4:
    iVar4 = tools::ByteBuffer::ReadInt(buffer);
LAB_001ce73b:
    value = (ulong)iVar4;
    break;
  case 0x35:
  case 0x36:
  case 0x37:
switchD_001ce6de_caseD_35:
    SkipFieldValue(buffer,(FieldDef *)buffer);
    PriceField::PriceField((PriceField *)this);
    aVar7 = extraout_RDX;
    goto LAB_001ce779;
  case FIXED8:
    value = tools::ByteBuffer::ReadLong(buffer);
    break;
  default:
    if (FVar1 == VARINT) {
      uVar5 = tools::Varint::ReadU64(&buffer->super_InputStream);
      uVar6 = EncodingUtil::PowerOfTen(field_def->scale_);
      value = uVar5 * uVar6;
    }
    else {
      if (FVar1 != ZIGZAG) goto switchD_001ce6de_caseD_35;
      uVar5 = tools::Varint::ReadU64(&buffer->super_InputStream);
      value = tools::Varint::ZigzagToLong(uVar5);
    }
  }
  PriceField::PriceField((PriceField *)this,value);
  aVar7 = extraout_RDX_00;
LAB_001ce779:
  PVar8.field_1.long_value_ = aVar7.long_value_;
  PVar8._0_8_ = this;
  return PVar8;
}

Assistant:

PriceField PriceUpdateDecoder::DecodeAsLong(ByteBuffer& buffer, FieldDef& field_def)
{
    switch(field_def.encoding_)
    {
        case FIXED1:
            return PriceField((int64_t) buffer.ReadByte());
        case FIXED2:
            return PriceField((int64_t) buffer.ReadShort());
        case FIXED3:
            return PriceField((int64_t) buffer.ReadMedium());
        case FIXED4:
            return PriceField((int64_t) buffer.ReadInt());
        case FIXED8:
            return PriceField(buffer.ReadLong());
        case VARINT:
            return PriceField((int64_t) (Varint::ReadU64(buffer) * EncodingUtil::PowerOfTen(field_def.scale_)));
        case ZIGZAG:
            return PriceField(static_cast<int64_t>(Varint::ZigzagToLong(tools::Varint::ReadU64(buffer))));
    }
    SkipFieldValue(buffer, field_def);
    return PriceField();

}